

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockSymbols.cpp
# Opt level: O3

StatementBlockSymbol *
slang::ast::StatementBlockSymbol::fromSyntax(Scope *scope,PatternCaseItemSyntax *syntax)

{
  Compilation *args;
  StatementBlockSymbol *pSVar1;
  span<const_slang::ast::StatementBlockSymbol_*const,_18446744073709551615UL> sVar2;
  VariableLifetime local_48;
  StatementBlockKind local_44;
  SourceLocation local_40;
  Token local_38;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  
  args = scope->compilation;
  local_28._M_len = 0;
  local_28._M_str = "";
  local_38 = slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)syntax);
  local_40 = parsing::Token::location(&local_38);
  local_44 = Sequential;
  local_48 = Automatic;
  pSVar1 = BumpAllocator::
           emplace<slang::ast::StatementBlockSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::StatementBlockKind,slang::ast::VariableLifetime>
                     (&args->super_BumpAllocator,args,&local_28,&local_40,&local_44,&local_48);
  (pSVar1->super_Symbol).originatingSyntax = (SyntaxNode *)syntax;
  sVar2 = Statement::createAndAddBlockItems(&pSVar1->super_Scope,(syntax->statement).ptr,false);
  pSVar1->blocks = sVar2;
  Scope::getOrAddDeferredData(&pSVar1->super_Scope);
  return pSVar1;
}

Assistant:

StatementBlockSymbol& StatementBlockSymbol::fromSyntax(const Scope& scope,
                                                       const PatternCaseItemSyntax& syntax) {
    auto& comp = scope.getCompilation();
    auto result = comp.emplace<StatementBlockSymbol>(comp, ""sv, syntax.getFirstToken().location(),
                                                     StatementBlockKind::Sequential,
                                                     VariableLifetime::Automatic);
    result->setSyntax(syntax);
    result->blocks = Statement::createAndAddBlockItems(*result, *syntax.statement,
                                                       /* labelHandled */ false);

    // This block needs elaboration to collect pattern variables.
    result->setNeedElaboration();

    return *result;
}